

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void calc_sad3_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int *chkpts_indices,int *cost_list)

{
  buf_2d *pbVar1;
  search_site_config *psVar2;
  int j_1;
  int iVar3;
  int j;
  long lVar4;
  FULLPEL_MV this_mv;
  uchar *block_offset [4];
  FULLPEL_MV local_74;
  uint *local_70;
  uint local_68 [4];
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  
  pbVar1 = (ms_params->ms_buffers).src;
  psVar2 = ms_params->search_sites;
  local_58 = center_address + psVar2->site[(uint)search_step][*chkpts_indices].offset;
  local_50 = center_address + psVar2->site[(uint)search_step][chkpts_indices[1]].offset;
  local_48 = center_address + psVar2->site[(uint)search_step][chkpts_indices[2]].offset;
  local_70 = bestsad;
  local_40 = center_address;
  (*ms_params->sdx3df)
            (pbVar1->buf,pbVar1->stride,&local_58,((ms_params->ms_buffers).ref)->stride,local_68);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    local_74.row = psVar2->site[(uint)search_step][chkpts_indices[lVar4]].mv.row + center_mv.row;
    local_74.col = psVar2->site[(uint)search_step][chkpts_indices[lVar4]].mv.col + center_mv.col;
    iVar3 = update_mvs_and_sad(local_68[lVar4],&local_74,mv_cost_params,local_70,raw_bestsad,best_mv
                               ,(FULLPEL_MV *)0x0);
    if (iVar3 != 0) {
      *best_site = (int)lVar4;
    }
  }
  if (cost_list != (int *)0x0) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      cost_list[(long)chkpts_indices[lVar4] + 1] = local_68[lVar4];
    }
  }
  return;
}

Assistant:

static inline void calc_sad3_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    FULLPEL_MV center_mv, const uint8_t *center_address, unsigned int *bestsad,
    unsigned int *raw_bestsad, int search_step, int *best_site,
    const int *chkpts_indices, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  unsigned char const *block_offset[4] = {
    center_address + site[chkpts_indices[0]].offset,
    center_address + site[chkpts_indices[1]].offset,
    center_address + site[chkpts_indices[2]].offset,
    center_address,
  };
  unsigned int sads[4];
  ms_params->sdx3df(src->buf, src->stride, block_offset, ref->stride, sads);
  for (int j = 0; j < 3; j++) {
    const int index = chkpts_indices[j];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = j;
  }
  if (cost_list) {
    for (int j = 0; j < 3; j++) {
      int index = chkpts_indices[j];
      cost_list[index + 1] = sads[j];
    }
  }
}